

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_enable_universal_pdgcode(mcpl_outfile_t of,int32_t pdgcode)

{
  char *pcVar1;
  
  if (pdgcode == 0) {
    pcVar1 = "mcpl_enable_universal_pdgcode must be called with non-zero pdgcode.";
  }
  else if (*(int *)((long)of.internal + 0x54) == 0) {
    if (*(int *)((long)of.internal + 0x60) != 0) {
      *(int32_t *)((long)of.internal + 0x54) = pdgcode;
      mcpl_recalc_psize(of);
      return;
    }
    pcVar1 = "mcpl_enable_universal_pdgcode called too late.";
  }
  else {
    if (*(int *)((long)of.internal + 0x54) == pdgcode) {
      return;
    }
    pcVar1 = "mcpl_enable_universal_pdgcode called multiple times";
  }
  (*mcpl_error_handler)(pcVar1);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_enable_universal_pdgcode(mcpl_outfile_t of, int32_t pdgcode)
{
  MCPLIMP_OUTFILEDECODE;
  if (pdgcode==0)
    mcpl_error("mcpl_enable_universal_pdgcode must be called with non-zero pdgcode.");
  if (f->opt_universalpdgcode) {
    if (f->opt_universalpdgcode!=pdgcode)
      mcpl_error("mcpl_enable_universal_pdgcode called multiple times");
    return;
  }
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_universal_pdgcode called too late.");
  f->opt_universalpdgcode = pdgcode;
  mcpl_recalc_psize(of);
}